

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::SmallVector<IOVariable,_8UL>::push_back
          (SmallVector<IOVariable,_8UL> *this,IOVariable *t)

{
  uint32_t uVar1;
  undefined7 uVar2;
  IOVariable *pIVar3;
  IOVariable *t_local;
  SmallVector<IOVariable,_8UL> *this_local;
  
  reserve(this,(this->super_VectorView<IOVariable>).buffer_size + 1);
  pIVar3 = (this->super_VectorView<IOVariable>).ptr +
           (this->super_VectorView<IOVariable>).buffer_size;
  pIVar3->var = t->var;
  uVar1 = t->block_member_index;
  pIVar3->location = t->location;
  pIVar3->block_member_index = uVar1;
  uVar2 = *(undefined7 *)&t->field_0x11;
  pIVar3->block = t->block;
  *(undefined7 *)&pIVar3->field_0x11 = uVar2;
  (this->super_VectorView<IOVariable>).buffer_size =
       (this->super_VectorView<IOVariable>).buffer_size + 1;
  return;
}

Assistant:

void push_back(T &&t) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(std::move(t));
		this->buffer_size++;
	}